

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O2

void __thiscall
density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
reentrant_put_transaction<double>::cancel(reentrant_put_transaction<double> *this)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)this->m_queue;
  if (__mutex == (pthread_mutex_t *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/conc_heter_queue.h"
               ,0x4f8);
    __mutex = (pthread_mutex_t *)this->m_queue;
  }
  std::mutex::lock((mutex *)&__mutex->__data);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<double>::cancel(&this->m_put_transaction);
  this->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void cancel() noexcept
            {
                DENSITY_ASSERT(!empty());
                std::lock_guard<std::mutex> lock(m_queue->m_mutex);
                m_put_transaction.cancel();
                m_queue = nullptr;
            }